

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

int32_t u_countChar32_63(UChar *s,int32_t length)

{
  UChar UVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  UChar *pUVar5;
  
  iVar2 = 0;
  if (-2 < length && s != (UChar *)0x0) {
    iVar2 = 0;
    if (length < 0) {
      UVar1 = *s;
      if (UVar1 != L'\0') {
        iVar2 = 0;
        do {
          pUVar5 = s + 1;
          if (((UVar1 & 0xfc00U) == 0xd800) && ((s[1] & 0xfc00U) == 0xdc00)) {
            pUVar5 = s + 2;
          }
          UVar1 = *pUVar5;
          iVar2 = iVar2 + 1;
          s = pUVar5;
        } while (UVar1 != L'\0');
      }
    }
    else if (length != 0) {
      iVar2 = 0;
      do {
        if (((length == 1) || ((*s & 0xfc00U) != 0xd800)) || ((s[1] & 0xfc00U) != 0xdc00)) {
          iVar3 = -1;
          lVar4 = 2;
        }
        else {
          iVar3 = -2;
          lVar4 = 4;
        }
        s = (UChar *)((long)s + lVar4);
        iVar2 = iVar2 + 1;
        length = length + iVar3;
      } while (length != 0);
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_countChar32(const UChar *s, int32_t length) {
    int32_t count;

    if(s==NULL || length<-1) {
        return 0;
    }

    count=0;
    if(length>=0) {
        while(length>0) {
            ++count;
            if(U16_IS_LEAD(*s) && length>=2 && U16_IS_TRAIL(*(s+1))) {
                s+=2;
                length-=2;
            } else {
                ++s;
                --length;
            }
        }
    } else /* length==-1 */ {
        UChar c;

        for(;;) {
            if((c=*s++)==0) {
                break;
            }
            ++count;

            /*
             * sufficient to look ahead one because of UTF-16;
             * safe to look ahead one because at worst that would be the terminating NUL
             */
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
        }
    }
    return count;
}